

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O2

int FFSread_raw_header(FFSFile file,void *dest,int buffer_size,FFSTypeHandle_conflict *fp)

{
  FFSTypeHandle_conflict ioformat;
  int iVar1;
  size_t __n;
  size_t sVar2;
  
  if (file->status == OpenForRead) {
    if (file->read_ahead == 0) {
      next_record_type(file);
    }
    do {
      if (file->next_record_type == FFSdata) {
        ioformat = file->next_actual_handle;
        *fp = ioformat;
        iVar1 = FFSheader_size(ioformat);
        __n = (size_t)iVar1;
        sVar2 = file->next_data_len - __n;
        memset(dest,0,__n);
        memcpy(dest,(ioformat->body->server_ID).value,(long)(ioformat->body->server_ID).length);
        iVar1 = (*file->read_func)(file->file_id,(void *)((long)dest + __n),sVar2,(int *)0x0,
                                   (char **)0x0);
        if (sVar2 == (long)iVar1) {
          file->read_ahead = 0;
          return 1;
        }
        file->next_record_type = (file->errno_val == 0) + FFSerror;
        return 0;
      }
      iVar1 = FFSconsume_next_item(file);
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

extern int
FFSread_raw_header(FFSFile file, void *dest, int buffer_size, FFSTypeHandle *fp)
{
    FFSTypeHandle f;
    int header_size;
    size_t read_size;

    if (file->status != OpenForRead)
	return 0;

    if (file->read_ahead == FALSE) {
	(void) next_record_type(file);
    }
    while (file->next_record_type != FFSdata) {
	if (!FFSconsume_next_item(file)) return 0;
    }

    f = file->next_actual_handle;
    *fp = f;
    header_size = FFSheader_size(f);
    read_size = file->next_data_len - header_size;
    /* should have buffer optimization logic here.  
     * I.E. if decode_in_place_possible() handle differently.  later
     */
    /* read into temporary memory */
    memset(dest, 0, header_size);
    memcpy(dest, f->body->server_ID.value, f->body->server_ID.length);
    if (file->read_func(file->file_id, (char*)dest+header_size, read_size, NULL, NULL) != read_size) {
	file->next_record_type = (file->errno_val) ? FFSerror : FFSend;
	return 0;
    }

    file->read_ahead = FALSE;
    return 1;
}